

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O3

Status __thiscall leveldb::anon_unknown_6::TwoLevelIterator::status(TwoLevelIterator *this)

{
  _func_int **pp_Var1;
  long in_RSI;
  long in_FS_OFFSET;
  Iterator *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  IteratorWrapper::status((IteratorWrapper *)&local_30);
  if (local_30 == (Iterator *)0x0) {
    if (*(long *)(in_RSI + 0x70) != 0) {
      IteratorWrapper::status((IteratorWrapper *)&local_30);
      if (local_30 != (Iterator *)0x0) goto LAB_00d0536a;
    }
    if (*(char **)(in_RSI + 0x48) == (char *)0x0) {
      pp_Var1 = (_func_int **)0x0;
    }
    else {
      pp_Var1 = (_func_int **)Status::CopyState(*(char **)(in_RSI + 0x48));
    }
    (this->super_Iterator)._vptr_Iterator = pp_Var1;
  }
  else {
LAB_00d0536a:
    operator_delete__(local_30);
    IteratorWrapper::status((IteratorWrapper *)this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status status() const override {
    // It'd be nice if status() returned a const Status& instead of a Status
    if (!index_iter_.status().ok()) {
      return index_iter_.status();
    } else if (data_iter_.iter() != nullptr && !data_iter_.status().ok()) {
      return data_iter_.status();
    } else {
      return status_;
    }
  }